

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void reset_fast_fail(compiler_common *common)

{
  sljit_compiler *compiler_00;
  int local_1c;
  sljit_s32 i;
  sljit_compiler *compiler;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  sljit_emit_op2(compiler_00,0x62,1,0,2,0,0x40,2);
  for (local_1c = common->fast_fail_start_ptr; local_1c < common->fast_fail_end_ptr;
      local_1c = local_1c + 8) {
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)local_1c,1,0);
  }
  return;
}

Assistant:

static SLJIT_INLINE void reset_fast_fail(compiler_common *common)
{
DEFINE_COMPILER;
sljit_s32 i;

SLJIT_ASSERT(common->fast_fail_start_ptr < common->fast_fail_end_ptr);

OP2(SLJIT_SUB, TMP1, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
for (i = common->fast_fail_start_ptr; i < common->fast_fail_end_ptr; i += sizeof(sljit_sw))
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), i, TMP1, 0);
}